

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O0

int nghttp2_pq_each(nghttp2_pq *pq,nghttp2_pq_item_cb fun,void *arg)

{
  int iVar1;
  ulong local_30;
  size_t i;
  void *arg_local;
  nghttp2_pq_item_cb fun_local;
  nghttp2_pq *pq_local;
  
  if (pq->length != 0) {
    for (local_30 = 0; local_30 < pq->length; local_30 = local_30 + 1) {
      iVar1 = (*fun)(pq->q[local_30],arg);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int nghttp2_pq_each(nghttp2_pq *pq, nghttp2_pq_item_cb fun, void *arg) {
  size_t i;

  if (pq->length == 0) {
    return 0;
  }
  for (i = 0; i < pq->length; ++i) {
    if ((*fun)(pq->q[i], arg)) {
      return 1;
    }
  }
  return 0;
}